

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O3

void __thiscall ScopedTempDir::CreateAndEnter(ScopedTempDir *this,string *name)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  char name_template [1024];
  undefined4 *local_428 [2];
  undefined4 local_418;
  uint uStack_414;
  
  pcVar2 = getenv("TMPDIR");
  local_428[0] = &local_418;
  if (pcVar2 == (char *)0x0) {
    local_418 = 0x706d742f;
    local_428[1] = (undefined4 *)0x4;
    uStack_414 = uStack_414 & 0xffffff00;
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,pcVar2,pcVar2 + sVar3);
  }
  std::__cxx11::string::operator=((string *)this,(string *)local_428);
  if (local_428[0] != &local_418) {
    operator_delete(local_428[0],CONCAT44(uStack_414,local_418) + 1);
  }
  if ((this->start_dir_)._M_string_length == 0) {
    Fatal("couldn\'t get system temp dir");
  }
  iVar1 = chdir((this->start_dir_)._M_dataplus._M_p);
  if (-1 < iVar1) {
    strcpy((char *)local_428,(name->_M_dataplus)._M_p);
    sVar3 = strlen((char *)local_428);
    *(undefined8 *)((long)local_428 + sVar3) = 0x5858585858582d;
    pcVar2 = mkdtemp((char *)local_428);
    if (pcVar2 == (char *)0x0) {
      piVar4 = __errno_location();
      pcVar2 = strerror(*piVar4);
      pcVar5 = "mkdtemp: %s";
      goto LAB_0018c8aa;
    }
    pcVar5 = (char *)(this->temp_dir_name_)._M_string_length;
    strlen(pcVar2);
    std::__cxx11::string::_M_replace((ulong)&this->temp_dir_name_,0,pcVar5,(ulong)pcVar2);
    iVar1 = chdir((this->temp_dir_name_)._M_dataplus._M_p);
    if (-1 < iVar1) {
      return;
    }
  }
  piVar4 = __errno_location();
  pcVar2 = strerror(*piVar4);
  pcVar5 = "chdir: %s";
LAB_0018c8aa:
  Fatal(pcVar5,pcVar2);
}

Assistant:

void ScopedTempDir::CreateAndEnter(const string& name) {
  // First change into the system temp dir and save it for cleanup.
  start_dir_ = GetSystemTempDir();
  if (start_dir_.empty())
    Fatal("couldn't get system temp dir");
  if (chdir(start_dir_.c_str()) < 0)
    Fatal("chdir: %s", strerror(errno));

  // Create a temporary subdirectory of that.
  char name_template[1024];
  strcpy(name_template, name.c_str());
  strcat(name_template, "-XXXXXX");
  char* tempname = mkdtemp(name_template);
  if (!tempname)
    Fatal("mkdtemp: %s", strerror(errno));
  temp_dir_name_ = tempname;

  // chdir into the new temporary directory.
  if (chdir(temp_dir_name_.c_str()) < 0)
    Fatal("chdir: %s", strerror(errno));
}